

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O2

err_t cmdCVCsPrint(octet *certs,size_t certs_len)

{
  err_t eVar1;
  btok_cvc_t *cvc;
  size_t cert_len;
  
  cvc = (btok_cvc_t *)blobCreate(0x128);
  eVar1 = 0x6e;
  if (cvc != (btok_cvc_t *)0x0) {
    eVar1 = 0;
  }
  do {
    if (certs_len == 0) {
LAB_00103b68:
      blobClose(cvc);
      return eVar1;
    }
    cert_len = btokCVCLen(certs,certs_len);
    if (cert_len == 0xffffffffffffffff) {
      eVar1 = 0x204;
      goto LAB_00103b68;
    }
    eVar1 = btokCVCUnwrap(cvc,certs,cert_len,(octet *)0x0,0);
    if (eVar1 != 0) goto LAB_00103b68;
    printf("  %s (%u bits, issued by %s, ",cvc->holder,(ulong)(uint)((int)cvc->pubkey_len * 2));
    eVar1 = cmdPrintDate(cvc->from);
    if (eVar1 != 0) goto LAB_00103b68;
    putchar(0x2d);
    eVar1 = cmdPrintDate(cvc->until);
    if (eVar1 != 0) goto LAB_00103b68;
    puts(")");
    certs = certs + cert_len;
    certs_len = certs_len - cert_len;
    eVar1 = 0;
  } while( true );
}

Assistant:

err_t cmdCVCsPrint(const octet* certs, size_t certs_len)
{
	err_t code;
	void* stack;
	btok_cvc_t* cvc;
	// pre
	ASSERT(memIsValid(certs, certs_len));
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(btok_cvc_t));
	cvc = (btok_cvc_t*)stack;
	// цикл по сертификатам
	while (certs_len)
	{
		// разобрать сертификат
		size_t len = btokCVCLen(certs, certs_len);
		if (len == SIZE_MAX)
			code = ERR_BAD_CERTRING;
		else
			code = btokCVCUnwrap(cvc, certs, len, 0, 0);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// печатать
		printf("  %s (%u bits, issued by %s, ",
			cvc->holder, (unsigned)cvc->pubkey_len * 2, cvc->authority);
		code = cmdPrintDate(cvc->from);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		printf("-");
		code = cmdPrintDate(cvc->until);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		printf(")\n");
		// к следующему
		certs += len, certs_len -= len;
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}